

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_frozen::basic_string<wchar_t>_&,_const_wchar_t_(&)[12]> * __thiscall
Catch::ExprLhs<frozen::basic_string<wchar_t>const&>::operator==
          (BinaryExpr<const_frozen::basic_string<wchar_t>_&,_const_wchar_t_(&)[12]>
           *__return_storage_ptr__,ExprLhs<frozen::basic_string<wchar_t>const&> *this,
          wchar_t (*rhs) [12])

{
  basic_string<wchar_t> *pbVar1;
  long lVar2;
  bool bVar3;
  StringRef local_38;
  
  pbVar1 = *(basic_string<wchar_t> **)this;
  if (pbVar1->size_ == 0xb) {
    lVar2 = 0;
    do {
      if (pbVar1->data_[lVar2] != (*rhs)[lVar2]) goto LAB_0017fcc5;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xb);
    bVar3 = true;
  }
  else {
LAB_0017fcc5:
    bVar3 = false;
  }
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001d07e8;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }